

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QAbstractItemView::clearSelection(QAbstractItemView *this)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)(this + 8) + 800);
  if (((lVar1 != 0) && (*(int *)(lVar1 + 4) != 0)) && (*(long *)(*(long *)(this + 8) + 0x328) != 0))
  {
    QItemSelectionModel::clearSelection();
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }